

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O0

gdImagePtr gdImageScale(gdImagePtr src,uint new_width,uint new_height)

{
  gdImagePtr local_28;
  gdImagePtr im_scaled;
  uint new_height_local;
  uint new_width_local;
  gdImagePtr src_local;
  
  if ((src == (gdImagePtr)0x0) || (GD_LINEAR < src->interpolation_id)) {
    src_local = (gdImagePtr)0x0;
  }
  else if ((new_width == 0) || (new_height == 0)) {
    src_local = (gdImagePtr)0x0;
  }
  else if ((new_width == src->sx) && (new_height == src->sy)) {
    src_local = gdImageClone(src);
  }
  else {
    switch(src->interpolation_id) {
    case GD_BILINEAR_FIXED:
    case GD_LINEAR:
      local_28 = gdImageScaleBilinear(src,new_width,new_height);
      break;
    case GD_BICUBIC:
    case GD_BICUBIC_FIXED:
      local_28 = gdImageScaleBicubicFixed(src,new_width,new_height);
      break;
    default:
      if (src->interpolation == (interpolation_method)0x0) {
        return (gdImagePtr)0x0;
      }
      local_28 = gdImageScaleTwoPass(src,new_width,new_height);
      break;
    case GD_NEAREST_NEIGHBOUR:
      local_28 = gdImageScaleNearestNeighbour(src,new_width,new_height);
    }
    src_local = local_28;
  }
  return src_local;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageScale(const gdImagePtr src, const unsigned int new_width, const unsigned int new_height)
{
	gdImagePtr im_scaled = NULL;

	if (src == NULL || (uintmax_t)src->interpolation_id >= GD_METHOD_COUNT) {
		return NULL;
	}

	if (new_width == 0 || new_height == 0) {
		return NULL;
	}
	if (new_width == gdImageSX(src) && new_height == gdImageSY(src)) {
		return gdImageClone(src);
	}
	switch (src->interpolation_id) {
		/*Special cases, optimized implementations */
		case GD_NEAREST_NEIGHBOUR:
			im_scaled = gdImageScaleNearestNeighbour(src, new_width, new_height);
			break;

		case GD_BILINEAR_FIXED:
		case GD_LINEAR:
			im_scaled = gdImageScaleBilinear(src, new_width, new_height);
			break;

		case GD_BICUBIC_FIXED:
		case GD_BICUBIC:
			im_scaled = gdImageScaleBicubicFixed(src, new_width, new_height);
			break;

		/* generic */
		default:
			if (src->interpolation == NULL) {
				return NULL;
			}
			im_scaled = gdImageScaleTwoPass(src, new_width, new_height);
			break;
	}

	return im_scaled;
}